

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall
HFactor::btranU(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      (factor_timer_clock_pointer->clock_).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[0x1f]);
  }
  if (this->update_method == 2) {
    if (factor_timer_clock_pointer == (HighsTimerClock *)0x0) {
      btranPF(this,rhs);
    }
    else {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x20]);
      btranPF(this,rhs);
      HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                       (factor_timer_clock_pointer->clock_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[0x20]);
    }
  }
  if (((0.15 < expected_density) || (rhs->count < 0)) ||
     (0.05 < (double)rhs->count * this->inv_num_row)) {
    if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x22]);
    }
    piVar3 = (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (uint)((ulong)((long)(this->u_pivot_index).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
    if ((int)uVar11 < 1) {
      dVar15 = 0.0;
      iVar13 = 0;
    }
    else {
      piVar4 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar14 = 0;
      dVar15 = 0.0;
      iVar13 = 0;
      do {
        iVar1 = piVar3[uVar14];
        lVar12 = (long)iVar1;
        if (lVar12 != -1) {
          if (ABS(pdVar5[lVar12]) <= 1e-14) {
            pdVar5[lVar12] = 0.0;
          }
          else {
            dVar16 = pdVar5[lVar12] / pdVar10[uVar14];
            piVar4[iVar13] = iVar1;
            pdVar5[lVar12] = dVar16;
            iVar1 = piVar6[uVar14];
            lVar12 = (long)iVar1;
            iVar2 = piVar7[uVar14];
            if ((long)this->num_row <= (long)uVar14) {
              dVar15 = dVar15 + (double)(iVar2 - iVar1);
            }
            iVar13 = iVar13 + 1;
            if (iVar1 < iVar2) {
              do {
                iVar1 = piVar8[lVar12];
                pdVar5[iVar1] = pdVar9[lVar12] * -dVar16 + pdVar5[iVar1];
                lVar12 = lVar12 + 1;
              } while (iVar2 != lVar12);
            }
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != (uVar11 & 0x7fffffff));
    }
    rhs->count = iVar13;
    rhs->synthetic_tick =
         dVar15 * 15.0 + (double)(int)((uVar11 - this->num_row) * 10) + rhs->synthetic_tick;
    lVar12 = 0x88;
  }
  else {
    if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x23]);
    }
    solveHyper(this->num_row,
               (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,rhs);
    lVar12 = 0x8c;
  }
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                     *(HighsInt *)
                      ((long)(factor_timer_clock_pointer->clock_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar12));
  }
  if (this->update_method == 1) {
    if (factor_timer_clock_pointer == (HighsTimerClock *)0x0) {
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
      btranFT(this,rhs);
      HVectorBase<double>::tight(rhs);
    }
    else {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x24]);
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
      btranFT(this,rhs);
      HVectorBase<double>::tight(rhs);
      HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                       (factor_timer_clock_pointer->clock_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[0x24]);
    }
  }
  if (this->update_method == 3) {
    if (factor_timer_clock_pointer == (HighsTimerClock *)0x0) {
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
      btranMPF(this,rhs);
      HVectorBase<double>::tight(rhs);
    }
    else {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x25]);
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
      btranMPF(this,rhs);
      HVectorBase<double>::tight(rhs);
      HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                       (factor_timer_clock_pointer->clock_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[0x25]);
    }
  }
  if (factor_timer_clock_pointer == (HighsTimerClock *)0x0) {
    return;
  }
  HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                   (factor_timer_clock_pointer->clock_).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[0x1f]);
  return;
}

Assistant:

void HFactor::btranU(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  FactorTimer factor_timer;
  factor_timer.start(FactorBtranUpper, factor_timer_clock_pointer);
  if (update_method == kUpdateMethodPf) {
    assert(!(update_method == kUpdateMethodPf));
    factor_timer.start(FactorBtranUpperPF, factor_timer_clock_pointer);
    btranPF(rhs);
    factor_timer.stop(FactorBtranUpperPF, factor_timer_clock_pointer);
  }

  // The regular part
  //
  // Determine style of solve
  const double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperBtranU;
  if (sparse_solve) {
    factor_timer.start(FactorBtranUpperSps, factor_timer_clock_pointer);
    // Alias to non constant
    double rhs_synthetic_tick = 0;
    // Alias to RHS
    double* rhs_array = rhs.array.data();
    HighsInt* rhs_index = rhs.index.data();
    // Alias to factor U
    const HighsInt* ur_start = this->ur_start.data();
    const HighsInt* ur_end = this->ur_lastp.data();
    const HighsInt* ur_index = this->ur_index.data();
    const double* ur_value = this->ur_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    HighsInt u_pivot_count = u_pivot_index.size();
    for (HighsInt i_logic = 0; i_logic < u_pivot_count; i_logic++) {
      // Skip void
      if (u_pivot_index[i_logic] == -1) continue;
      // Normal part
      const HighsInt pivotRow = u_pivot_index[i_logic];
      double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        pivot_multiplier /= u_pivot_value[i_logic];
        rhs_index[rhs_count++] = pivotRow;
        rhs_array[pivotRow] = pivot_multiplier;
        const HighsInt start = ur_start[i_logic];
        const HighsInt end = ur_end[i_logic];
        if (i_logic >= num_row) {
          rhs_synthetic_tick += (end - start);
        }
        for (HighsInt k = start; k < end; k++)
          rhs_array[ur_index[k]] -= pivot_multiplier * ur_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    rhs.synthetic_tick +=
        rhs_synthetic_tick * 15 + (u_pivot_count - num_row) * 10;
    factor_timer.stop(FactorBtranUpperSps, factor_timer_clock_pointer);
  } else {
    factor_timer.start(FactorBtranUpperHyper, factor_timer_clock_pointer);
    solveHyper(num_row, u_pivot_lookup.data(), u_pivot_index.data(),
               u_pivot_value.data(), &ur_start[0], ur_lastp.data(),
               &ur_index[0], &ur_value[0], &rhs);
    factor_timer.stop(FactorBtranUpperHyper, factor_timer_clock_pointer);
  }

  // The update part
  assert(rhs.count >= 0);
  if (update_method == kUpdateMethodFt) {
    factor_timer.start(FactorBtranUpperFT, factor_timer_clock_pointer);
    rhs.tight();
    rhs.pack();
    btranFT(rhs);
    rhs.tight();
    factor_timer.stop(FactorBtranUpperFT, factor_timer_clock_pointer);
  }
  if (update_method == kUpdateMethodMpf) {
    assert(!(update_method == kUpdateMethodMpf));
    factor_timer.start(FactorBtranUpperMPF, factor_timer_clock_pointer);
    rhs.tight();
    rhs.pack();
    btranMPF(rhs);
    rhs.tight();
    factor_timer.stop(FactorBtranUpperMPF, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorBtranUpper, factor_timer_clock_pointer);
}